

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  cmGlobalGenerator *this_00;
  cmMakefile *this_01;
  string *psVar5;
  cmTarget *this_02;
  cmGeneratorTarget *this_03;
  cmLocalGenerator *pcVar6;
  bool in_DL;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  char *__format;
  cmOutputConverter *outputConverter;
  string *lib;
  pointer lib_00;
  string includes;
  string includeFlags;
  string buildType;
  string definitions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string frameworkPath;
  string mode;
  string linkPath;
  string packageName;
  string language;
  cmStateSnapshot snapshot;
  string linkFlags;
  string flags;
  string systemFile;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&includes,(SystemTools *)0x1,in_DL);
  SetHomeDirectory(this,&includes);
  std::__cxx11::string::~string((string *)&includes);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&includes,(SystemTools *)0x1,collapse);
  SetHomeOutputDirectory(this,&includes);
  std::__cxx11::string::~string((string *)&includes);
  this_00 = (cmGlobalGenerator *)operator_new(0x608);
  cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  SetGlobalGenerator(this,this_00);
  snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
  snapshot.State = (this->CurrentSnapshot).State;
  snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&includes,&snapshot);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&includeFlags,(SystemTools *)0x1,collapse_00);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&includes,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&includes,&snapshot);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&includeFlags,(SystemTools *)0x1,collapse_01);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&includes,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  cmStateSnapshot::SetDefaultDefinitions(&snapshot);
  this_01 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(this_01,this_00,&snapshot);
  cmGlobalGenerator::AddMakefile(this_00,this_01);
  cmMakefile::SetArgcArgv(this_01,args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"CMakeFindPackageMode.cmake",(allocator<char> *)&includeFlags);
  cmMakefile::GetModulesFile(&systemFile,this_01,&includes);
  std::__cxx11::string::~string((string *)&includes);
  cmMakefile::ReadListFile(this_01,&systemFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"LANGUAGE",(allocator<char> *)&includeFlags);
  psVar5 = cmMakefile::GetSafeDefinition(this_01,&includes);
  std::__cxx11::string::string((string *)&language,(string *)psVar5);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"MODE",(allocator<char> *)&includeFlags);
  psVar5 = cmMakefile::GetSafeDefinition(this_01,&includes);
  std::__cxx11::string::string((string *)&mode,(string *)psVar5);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"NAME",(allocator<char> *)&includeFlags);
  psVar5 = cmMakefile::GetSafeDefinition(this_01,&includes);
  std::__cxx11::string::string((string *)&packageName,(string *)psVar5);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"PACKAGE_FOUND",(allocator<char> *)&includeFlags);
  bVar2 = cmMakefile::IsOn(this_01,&includes);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"PACKAGE_QUIET",(allocator<char> *)&includeFlags);
  bVar3 = cmMakefile::IsOn(this_01,&includes);
  std::__cxx11::string::~string((string *)&includes);
  if (bVar2) {
    bVar4 = std::operator==(&mode,"EXIST");
    if (!bVar4) {
      bVar3 = std::operator==(&mode,"COMPILE");
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&includeFlags,"PACKAGE_INCLUDE_DIRS",(allocator<char> *)&definitions);
        psVar5 = cmMakefile::GetSafeDefinition(this_01,&includeFlags);
        std::__cxx11::string::string((string *)&includes,(string *)psVar5);
        std::__cxx11::string::~string((string *)&includeFlags);
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&includes,&includeDirs,false);
        cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
        pcVar6 = *(this_00->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&definitions,"",(allocator<char> *)&buildType);
        cmLocalGenerator::GetIncludeFlags
                  (&includeFlags,pcVar6,&includeDirs,(cmGeneratorTarget *)0x0,&language,false,false,
                   &definitions);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buildType,"PACKAGE_DEFINITIONS",(allocator<char> *)&frameworkPath);
        psVar5 = cmMakefile::GetSafeDefinition(this_01,&buildType);
        std::__cxx11::string::string((string *)&definitions,(string *)psVar5);
        std::__cxx11::string::~string((string *)&buildType);
        printf("%s %s\n",includeFlags._M_dataplus._M_p,definitions._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::~string((string *)&includeFlags);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&includeDirs);
        std::__cxx11::string::~string((string *)&includes);
      }
      else {
        bVar3 = std::operator==(&mode,"LINK");
        if (bVar3) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"dummy",(allocator<char> *)&includeFlags);
          this_02 = cmMakefile::AddExecutable(this_01,&includes,&srcs,true);
          std::__cxx11::string::~string((string *)&includes);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"LINKER_LANGUAGE",(allocator<char> *)&includeFlags);
          cmTarget::SetProperty(this_02,&includes,language._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&includes);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"PACKAGE_LIBRARIES",(allocator<char> *)&includeFlags);
          psVar5 = cmMakefile::GetSafeDefinition(this_01,&includes);
          std::__cxx11::string::string((string *)&definitions,(string *)psVar5);
          std::__cxx11::string::~string((string *)&includes);
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument(&definitions,&libList,false);
          pbVar1 = libList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (lib_00 = libList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; lib_00 != pbVar1;
              lib_00 = lib_00 + 1) {
            cmTarget::AddLinkLibrary(this_02,this_01,lib_00,GENERAL_LibraryType);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"CMAKE_BUILD_TYPE",(allocator<char> *)&includeFlags);
          psVar5 = cmMakefile::GetSafeDefinition(this_01,&includes);
          std::__cxx11::string::string((string *)&buildType,(string *)psVar5);
          std::__cxx11::string::~string((string *)&includes);
          cmsys::SystemTools::UpperCase(&includes,&buildType);
          std::__cxx11::string::operator=((string *)&buildType,(string *)&includes);
          std::__cxx11::string::~string((string *)&includes);
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&includeDirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
          frameworkPath._M_string_length = 0;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)includeDirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          frameworkPath.field_2._M_local_buf[0] = '\0';
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          linkPath._M_string_length = 0;
          flags._M_dataplus._M_p = (pointer)&flags.field_2;
          flags._M_string_length = 0;
          linkPath.field_2._M_local_buf[0] = '\0';
          flags.field_2._M_local_buf[0] = '\0';
          linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
          linkFlags._M_string_length = 0;
          linkFlags.field_2._M_local_buf[0] = '\0';
          cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
          psVar5 = cmTarget::GetName_abi_cxx11_(this_02);
          this_03 = cmGlobalGenerator::FindGeneratorTarget(this_00,psVar5);
          pcVar6 = cmGeneratorTarget::GetLocalGenerator(this_03);
          outputConverter = &pcVar6->super_cmOutputConverter;
          if (pcVar6 == (cmLocalGenerator *)0x0) {
            outputConverter = (cmOutputConverter *)0x0;
          }
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_168,pcVar6);
          cmStateSnapshot::GetDirectory
                    ((cmStateDirectory *)&includeFlags,(cmStateSnapshot *)&local_168);
          cmLinkLineComputer::cmLinkLineComputer
                    ((cmLinkLineComputer *)&includes,outputConverter,
                     (cmStateDirectory *)&includeFlags);
          cmLocalGenerator::GetTargetFlags
                    (pcVar6,(cmLinkLineComputer *)&includes,&buildType,(string *)&includeDirs,&flags
                     ,&linkFlags,&frameworkPath,&linkPath,this_03);
          std::operator+(&local_168,&frameworkPath,&linkPath);
          std::operator+(&includeFlags,&local_168,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &includeDirs);
          std::__cxx11::string::operator=((string *)&includeDirs,(string *)&includeFlags);
          std::__cxx11::string::~string((string *)&includeFlags);
          std::__cxx11::string::~string((string *)&local_168);
          puts((char *)includeDirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)&includes);
          std::__cxx11::string::~string((string *)&linkFlags);
          std::__cxx11::string::~string((string *)&flags);
          std::__cxx11::string::~string((string *)&linkPath);
          std::__cxx11::string::~string((string *)&frameworkPath);
          std::__cxx11::string::~string((string *)&includeDirs);
          std::__cxx11::string::~string((string *)&buildType);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libList);
          std::__cxx11::string::~string((string *)&definitions);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&srcs);
        }
      }
      goto LAB_00176732;
    }
    if (bVar3) goto LAB_00176732;
    __format = "%s found.\n";
  }
  else {
    if (bVar3) goto LAB_00176732;
    __format = "%s not found.\n";
  }
  printf(__format,packageName._M_dataplus._M_p);
LAB_00176732:
  std::__cxx11::string::~string((string *)&packageName);
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::~string((string *)&language);
  std::__cxx11::string::~string((string *)&systemFile);
  return bVar2;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  cmMakefile* mf = new cmMakefile(gg, snapshot);
  gg->AddMakefile(mf);

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST") {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE") {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    gg->CreateGenerationObjects();
    cmLocalGenerator* lg = gg->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK") {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGenerationObjects();
    cmGeneratorTarget* gtgt = gg->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  // free generic one if generated
  //  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
  //  delete gg; // this crashes inside the cmake instance

  return packageFound;
}